

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

MP<6UL,_GF2::MOGrevlex<6UL>_> * __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::SPoly
          (MP<6UL,_GF2::MOGrevlex<6UL>_> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *poly)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  const_iterator iter;
  WW<6UL> WVar5;
  value_type local_30;
  
  uVar1 = (ulong)(this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                 super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
                 super__List_node_base._M_next[1]._M_next;
  uVar2 = (ulong)(poly->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                 super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
                 super__List_node_base._M_next[1]._M_next;
  WVar5._words[0] = (word  [1])(~uVar1 & uVar2);
  local_30.super_WW<6UL>._words[0] = (WW<6UL>)(WW<6UL>)WVar5._words[0];
  std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::pop_front
            (&this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>);
  p_Var4 = (_List_node_base *)this;
  while (p_Var4 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var4->_M_next)->
                  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
                  super__List_node_base._M_next, p_Var4 != (_List_node_base *)this) {
    *(ulong *)(p_Var4 + 1) = *(ulong *)(p_Var4 + 1) | (ulong)WVar5._words[0];
  }
  p_Var4 = (poly->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
           super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  uVar3 = *(ulong *)&((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)(p_Var4 + 1))->
                     super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>;
  while (p_Var4 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var4->_M_next)->
                  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
                  super__List_node_base._M_next, p_Var4 != (_List_node_base *)poly) {
    local_30.super_WW<6UL>._words[0] = (WW<6UL>)(*(ulong *)(p_Var4 + 1) | ~uVar3 & (uVar2 | uVar1));
    std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::push_back
              (&this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>,&local_30);
  }
  Normalize(this);
  return this;
}

Assistant:

MP& SPoly(const MP& poly)
	{
		// предусловия
		assert(IsConsistent(poly) && this != &poly);
		// сбор мономов
		MM<_n> lm, m;
		(m = lm.LCM(LM(), poly.LM())) /= LM();
		PopLM();
		for (iterator iter = begin(); iter != end(); ++iter)
			*iter *= m;
		lm /= poly.LM();
		for (const_iterator iter = poly.begin(); ++iter != poly.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}